

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O2

void test_filled_and_inverted_text(wins *wins_ar,int ar_len,Am_Style *bs)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 << 6 != uVar3; uVar3 = uVar3 + 0x40) {
    plVar1 = *(long **)((long)&wins_ar->font_win + uVar3);
    (**(code **)(*plVar1 + 0x170))(plVar1,&black,"FILLED",6,&font_large,0x5a,400,0,bs,0);
    (**(code **)(*plVar1 + 0x170))(plVar1,&black,"INVERTED",8,&font_large,0x5a,0x1ae,0,bs,1);
    (**(code **)(*plVar1 + 0xa0))(plVar1);
  }
  return;
}

Assistant:

void
test_filled_and_inverted_text(wins *wins_ar, int ar_len, Am_Style &bs)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    font_win->Draw_Text(black, "FILLED", 6, font_large, 90, 400, Am_DRAW_COPY,
                        bs, false);
    font_win->Draw_Text(black, "INVERTED", 8, font_large, 90, 430, Am_DRAW_COPY,
                        bs, true);
    font_win->Flush_Output();
  }
}